

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_open_w(archive *_a,wchar_t *pathname)

{
  int iVar1;
  wchar_t wVar2;
  size_t len;
  int *piVar3;
  wchar_t local_44;
  wchar_t magic_test;
  wchar_t ret;
  archive_string path;
  archive_read_disk *a;
  wchar_t *pathname_local;
  archive *_a_local;
  
  path.buffer_length = (size_t)_a;
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x21,"archive_read_disk_open_w");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    archive_clear_error((archive *)path.buffer_length);
    _magic_test = (char *)0x0;
    path.s = (char *)0x0;
    path.length = 0;
    len = wcslen(pathname);
    wVar2 = archive_string_append_from_wcs((archive_string *)&magic_test,pathname,len);
    if (wVar2 == L'\0') {
      local_44 = _archive_read_disk_open(_a,_magic_test);
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) {
        archive_set_error((archive *)path.buffer_length,0xc,"Can\'t allocate memory");
      }
      else {
        archive_set_error((archive *)path.buffer_length,-1,"Can\'t convert a path to a char string")
        ;
      }
      *(undefined4 *)(path.buffer_length + 4) = 0x8000;
      local_44 = L'\xffffffe2';
    }
    archive_string_free((archive_string *)&magic_test);
    _a_local._4_4_ = local_44;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_disk_open_w(struct archive *_a, const wchar_t *pathname)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct archive_string path;
	int ret;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_NEW | ARCHIVE_STATE_CLOSED,
	    "archive_read_disk_open_w");
	archive_clear_error(&a->archive);

	/* Make a char string from a wchar_t string. */
	archive_string_init(&path);
	if (archive_string_append_from_wcs(&path, pathname,
	    wcslen(pathname)) != 0) {
		if (errno == ENOMEM)
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
		else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't convert a path to a char string");
		a->archive.state = ARCHIVE_STATE_FATAL;
		ret = ARCHIVE_FATAL;
	} else
		ret = _archive_read_disk_open(_a, path.s);

	archive_string_free(&path);
	return (ret);
}